

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

int vec_expand_(char **data,int *length,int *capacity,int memsz,char *alloc_category)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = *capacity;
  iVar3 = 0;
  if (iVar1 <= *length) {
    iVar4 = 1;
    if (iVar1 != 0) {
      iVar4 = iVar1 * 2;
    }
    pcVar2 = (char *)golf_realloc_tracked(*data,(long)(memsz * iVar4),alloc_category);
    if (pcVar2 == (char *)0x0) {
      iVar3 = -1;
    }
    else {
      *data = pcVar2;
      *capacity = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int vec_expand_(char **data, int *length, int *capacity, int memsz, const char *alloc_category) {
  if (*length + 1 > *capacity) {
    void *ptr;
    int n = (*capacity == 0) ? 1 : *capacity << 1;
    ptr = golf_realloc_tracked(*data, n * memsz, alloc_category);
    if (ptr == NULL) return -1;
    *data = ptr;
    *capacity = n;
  }
  return 0;
}